

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

string_view __thiscall ritobin::io::impl_text_read::TextReader::read_word(TextReader *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  string_view sVar7;
  
  pbVar4 = (byte *)this->cur_;
  pbVar2 = (byte *)this->cap_;
  pbVar5 = pbVar4;
  while (((pbVar6 = pbVar5, pbVar5 != pbVar2 && ((ulong)*pbVar5 < 0x21)) &&
         ((0x100002200U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
    pbVar5 = pbVar5 + 1;
    this->cur_ = (char *)pbVar5;
    pbVar4 = pbVar4 + 1;
  }
  while ((pbVar3 = pbVar2, pbVar6 != pbVar2 &&
         (((bVar1 = *pbVar6, bVar1 == 0x2b || (bVar1 == 0x5f)) ||
          (((byte)(bVar1 - 0x30) < 10 ||
           (((byte)(bVar1 - 0x2d) < 2 || (pbVar3 = pbVar6, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)))))
          )))) {
    this->cur_ = (char *)(pbVar6 + 1);
    pbVar6 = pbVar6 + 1;
  }
  sVar7._M_len = (long)pbVar3 - (long)pbVar4;
  sVar7._M_str = (char *)pbVar5;
  return sVar7;
}

Assistant:

constexpr std::string_view read_word() noexcept {
            while (!is_eof() && one_of<' ', '\t', '\r'>(*cur_)) {
                cur_++;
            }
            auto const beg = cur_;
            while (!is_eof() && (one_of<'_', '+', '-', '.'>(*cur_)
                || in_range<'A', 'Z'>(*cur_)
                || in_range<'a', 'z'>(*cur_)
                || in_range<'0', '9'>(*cur_))) {
                cur_++;
            }
            return { beg, static_cast<size_t>(cur_ - beg) };
        }